

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *poVar1;
  SourceLineInfo local_40;
  Colour local_11;
  AssertionPrinter *pAStack_10;
  Colour colourGuard;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  Colour::Colour(&local_11,FileName);
  poVar1 = this->stream;
  AssertionResult::getSourceInfo(&local_40,this->result);
  poVar1 = Catch::operator<<(poVar1,&local_40);
  std::operator<<(poVar1,": ");
  SourceLineInfo::~SourceLineInfo(&local_40);
  Colour::~Colour(&local_11);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }